

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O0

string_view absl::FindLongestCommonPrefix(string_view a,string_view b)

{
  uint16_t uVar1;
  uint16_t uVar2;
  type tVar3;
  unsigned_long *puVar4;
  const_pointer __str;
  const_pointer pvVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  long lVar9;
  uint64_t xor_bytes;
  uint64_t xor_bytes_2;
  uint16_t xor_bytes_1;
  size_type count;
  char *pb;
  char *pa;
  size_type limit;
  size_type local_60;
  size_type local_48;
  size_type local_40;
  unsigned_long local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  string_view local_10;
  
  local_40 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_20);
  local_48 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_30);
  puVar4 = std::min<unsigned_long>(&local_40,&local_48);
  local_38 = *puVar4;
  __str = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_20);
  pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_30);
  local_60 = 0;
  if (local_38 < 8) {
    for (; local_60 + 2 <= local_38; local_60 = local_60 + 2) {
      uVar1 = little_endian::Load16((Nonnull<const_void_*>)0x3c1adb);
      uVar2 = little_endian::Load16((Nonnull<const_void_*>)0x3c1af1);
      if ((uVar1 ^ uVar2) != 0) {
        if (((uVar1 ^ uVar2) & 0xff) == 0) {
          local_60 = local_60 + 1;
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_10,__str,local_60);
        return local_10;
      }
    }
    if ((local_60 != local_38) && (__str[local_60] == pvVar5[local_60])) {
      local_60 = local_60 + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_10,__str,local_60);
  }
  else {
    do {
      uVar6 = little_endian::Load64((Nonnull<const_void_*>)0x3c1bc1);
      uVar7 = little_endian::Load64((Nonnull<const_void_*>)0x3c1bd5);
      if ((uVar6 ^ uVar7) != 0) {
        tVar3 = countr_zero<unsigned_long>(uVar6 ^ uVar7);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_10,__str,(long)(tVar3 >> 3) + local_60);
        return local_10;
      }
      uVar8 = local_60 + 0x10;
      local_60 = local_60 + 8;
    } while (uVar8 < local_38);
    lVar9 = local_38 - 8;
    uVar6 = little_endian::Load64((Nonnull<const_void_*>)0x3c1c61);
    uVar7 = little_endian::Load64((Nonnull<const_void_*>)0x3c1c75);
    if ((uVar6 ^ uVar7) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_10,__str,local_38);
    }
    else {
      tVar3 = countr_zero<unsigned_long>(uVar6 ^ uVar7);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_10,__str,(tVar3 >> 3) + lVar9);
    }
  }
  return local_10;
}

Assistant:

absl::string_view FindLongestCommonPrefix(absl::string_view a,
                                          absl::string_view b) {
  const absl::string_view::size_type limit = std::min(a.size(), b.size());
  const char* const pa = a.data();
  const char* const pb = b.data();
  absl::string_view::size_type count = (unsigned) 0;

  if (ABSL_PREDICT_FALSE(limit < 8)) {
    while (ABSL_PREDICT_TRUE(count + 2 <= limit)) {
      uint16_t xor_bytes = absl::little_endian::Load16(pa + count) ^
                           absl::little_endian::Load16(pb + count);
      if (ABSL_PREDICT_FALSE(xor_bytes != 0)) {
        if (ABSL_PREDICT_TRUE((xor_bytes & 0xff) == 0)) ++count;
        return absl::string_view(pa, count);
      }
      count += 2;
    }
    if (ABSL_PREDICT_TRUE(count != limit)) {
      if (ABSL_PREDICT_TRUE(pa[count] == pb[count])) ++count;
    }
    return absl::string_view(pa, count);
  }

  do {
    uint64_t xor_bytes = absl::little_endian::Load64(pa + count) ^
                         absl::little_endian::Load64(pb + count);
    if (ABSL_PREDICT_FALSE(xor_bytes != 0)) {
      count += static_cast<uint64_t>(absl::countr_zero(xor_bytes) >> 3);
      return absl::string_view(pa, count);
    }
    count += 8;
  } while (ABSL_PREDICT_TRUE(count + 8 < limit));

  count = limit - 8;
  uint64_t xor_bytes = absl::little_endian::Load64(pa + count) ^
                       absl::little_endian::Load64(pb + count);
  if (ABSL_PREDICT_TRUE(xor_bytes != 0)) {
    count += static_cast<uint64_t>(absl::countr_zero(xor_bytes) >> 3);
    return absl::string_view(pa, count);
  }
  return absl::string_view(pa, limit);
}